

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O1

Gia_Man_t * Gia_ManSpecReduceTrace(Gia_Man_t *p,Vec_Int_t *vTrace,Vec_Int_t *vMap)

{
  int iVar1;
  char *pcVar2;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pGVar4;
  int iVar5;
  Vec_Int_t *vXorLits;
  int *piVar6;
  Gia_Man_t *p_00;
  size_t sVar7;
  char *pcVar8;
  Gia_Obj_t *pGVar9;
  Vec_Int_t *pVVar10;
  Gia_Man_t *pGVar11;
  ulong uVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  long lVar16;
  
  if (p->pReprs == (Gia_Rpr_t *)0x0) {
    Abc_Print(1,"Gia_ManSpecReduce(): Equivalence classes are not available.\n");
    pGVar11 = (Gia_Man_t *)0x0;
  }
  else {
    vTrace->nSize = 0;
    vXorLits = (Vec_Int_t *)malloc(0x10);
    vXorLits->nCap = 1000;
    vXorLits->nSize = 0;
    piVar6 = (int *)malloc(4000);
    vXorLits->pArray = piVar6;
    Gia_ManSetPhase(p);
    Gia_ManFillValue(p);
    p_00 = Gia_ManStart(p->nObjs);
    pcVar2 = p->pName;
    if (pcVar2 == (char *)0x0) {
      pcVar8 = (char *)0x0;
    }
    else {
      sVar7 = strlen(pcVar2);
      pcVar8 = (char *)malloc(sVar7 + 1);
      strcpy(pcVar8,pcVar2);
    }
    p_00->pName = pcVar8;
    pcVar2 = p->pSpec;
    if (pcVar2 == (char *)0x0) {
      pcVar8 = (char *)0x0;
    }
    else {
      sVar7 = strlen(pcVar2);
      pcVar8 = (char *)malloc(sVar7 + 1);
      strcpy(pcVar8,pcVar2);
    }
    p_00->pSpec = pcVar8;
    Gia_ManHashAlloc(p_00);
    p->pObjs->Value = 0;
    pVVar10 = p->vCis;
    if (0 < pVVar10->nSize) {
      lVar16 = 0;
      do {
        iVar5 = pVVar10->pArray[lVar16];
        if (((long)iVar5 < 0) || (p->nObjs <= iVar5)) goto LAB_001ff752;
        pGVar3 = p->pObjs;
        if (pGVar3 == (Gia_Obj_t *)0x0) break;
        pGVar9 = Gia_ManAppendObj(p_00);
        uVar12 = *(ulong *)pGVar9;
        *(ulong *)pGVar9 = uVar12 | 0x9fffffff;
        *(ulong *)pGVar9 =
             uVar12 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar4 = p_00->pObjs;
        if ((pGVar9 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar9)) {
LAB_001ff771:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar9 - (long)pGVar4) >> 2) * -0x55555555);
        pGVar4 = p_00->pObjs;
        if ((pGVar9 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar9)) goto LAB_001ff771;
        pGVar3[iVar5].Value = (int)((ulong)((long)pGVar9 - (long)pGVar4) >> 2) * 0x55555556;
        lVar16 = lVar16 + 1;
        pVVar10 = p->vCis;
      } while (lVar16 < pVVar10->nSize);
    }
    iVar5 = p->nRegs;
    if (0 < iVar5) {
      iVar14 = 0;
      do {
        iVar1 = p->vCis->nSize;
        uVar13 = (iVar1 - iVar5) + iVar14;
        if (((int)uVar13 < 0) || (iVar1 <= (int)uVar13)) goto LAB_001ff790;
        iVar5 = p->vCis->pArray[uVar13];
        if (((long)iVar5 < 0) || (p->nObjs <= iVar5)) goto LAB_001ff752;
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        Gia_ManSpecBuild(p_00,p,p->pObjs + iVar5,vXorLits,0,1,vTrace,(Vec_Int_t *)0x0,vMap);
        iVar14 = iVar14 + 1;
        iVar5 = p->nRegs;
      } while (iVar14 < iVar5);
    }
    pVVar10 = p->vCos;
    if (0 < pVVar10->nSize) {
      lVar16 = 0;
      do {
        iVar5 = pVVar10->pArray[lVar16];
        if (((long)iVar5 < 0) || (p->nObjs <= iVar5)) goto LAB_001ff752;
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        pGVar3 = p->pObjs + iVar5;
        Gia_ManSpecReduce_rec
                  (p_00,p,pGVar3 + -(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff),vXorLits,0,1,
                   vTrace,(Vec_Int_t *)0x0,vMap);
        lVar16 = lVar16 + 1;
        pVVar10 = p->vCos;
      } while (lVar16 < pVVar10->nSize);
    }
    pVVar10 = p->vCos;
    uVar12 = (ulong)(uint)pVVar10->nSize;
    if (p->nRegs < pVVar10->nSize) {
      lVar16 = 0;
      do {
        if ((int)uVar12 <= lVar16) goto LAB_001ff790;
        iVar5 = pVVar10->pArray[lVar16];
        if (((long)iVar5 < 0) || (p->nObjs <= iVar5)) goto LAB_001ff752;
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        pGVar3 = p->pObjs + iVar5;
        uVar15 = (uint)*(undefined8 *)pGVar3;
        uVar13 = pGVar3[-(ulong)(uVar15 & 0x1fffffff)].Value;
        if ((int)uVar13 < 0) goto LAB_001ff7af;
        Gia_ManAppendCo(p_00,uVar15 >> 0x1d & 1 ^ uVar13);
        lVar16 = lVar16 + 1;
        pVVar10 = p->vCos;
        uVar12 = (ulong)pVVar10->nSize;
      } while (lVar16 < (long)(uVar12 - (long)p->nRegs));
    }
    iVar5 = vXorLits->nSize;
    if (0 < iVar5) {
      lVar16 = 0;
      do {
        Gia_ManAppendCo(p_00,vXorLits->pArray[lVar16]);
        lVar16 = lVar16 + 1;
        iVar5 = vXorLits->nSize;
      } while (lVar16 < iVar5);
    }
    if (iVar5 == 0) {
      Abc_Print(1,"Speculatively reduced model has no primary outputs.\n");
      Gia_ManAppendCo(p_00,0);
    }
    iVar5 = p->nRegs;
    if (0 < iVar5) {
      iVar14 = 0;
      do {
        iVar1 = p->vCos->nSize;
        uVar13 = (iVar1 - iVar5) + iVar14;
        if (((int)uVar13 < 0) || (iVar1 <= (int)uVar13)) {
LAB_001ff790:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar5 = p->vCos->pArray[uVar13];
        if (((long)iVar5 < 0) || (p->nObjs <= iVar5)) {
LAB_001ff752:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        pGVar3 = p->pObjs + iVar5;
        uVar15 = (uint)*(undefined8 *)pGVar3;
        uVar13 = pGVar3[-(ulong)(uVar15 & 0x1fffffff)].Value;
        if ((int)uVar13 < 0) {
LAB_001ff7af:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x132,"int Abc_LitNotCond(int, int)");
        }
        Gia_ManAppendCo(p_00,uVar15 >> 0x1d & 1 ^ uVar13);
        iVar14 = iVar14 + 1;
        iVar5 = p->nRegs;
      } while (iVar14 < iVar5);
    }
    Gia_ManHashStop(p_00);
    if (vXorLits->pArray != (int *)0x0) {
      free(vXorLits->pArray);
      vXorLits->pArray = (int *)0x0;
    }
    free(vXorLits);
    Gia_ManSetRegNum(p_00,p->nRegs);
    pGVar11 = Gia_ManCleanup(p_00);
    Gia_ManStop(p_00);
  }
  return pGVar11;
}

Assistant:

Gia_Man_t * Gia_ManSpecReduceTrace( Gia_Man_t * p, Vec_Int_t * vTrace, Vec_Int_t * vMap )
{
    Vec_Int_t * vXorLits;
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i, iLitNew;
    if ( !p->pReprs )
    {
        Abc_Print( 1, "Gia_ManSpecReduce(): Equivalence classes are not available.\n" );
        return NULL;
    }
    Vec_IntClear( vTrace );
    vXorLits = Vec_IntAlloc( 1000 );
    Gia_ManSetPhase( p );
    Gia_ManFillValue( p );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManHashAlloc( pNew );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    Gia_ManForEachRo( p, pObj, i )
        Gia_ManSpecBuild( pNew, p, pObj, vXorLits, 0, 1, vTrace, NULL, vMap );
    Gia_ManForEachCo( p, pObj, i )
        Gia_ManSpecReduce_rec( pNew, p, Gia_ObjFanin0(pObj), vXorLits, 0, 1, vTrace, NULL, vMap );
    Gia_ManForEachPo( p, pObj, i )
        Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Vec_IntForEachEntry( vXorLits, iLitNew, i )
        Gia_ManAppendCo( pNew, iLitNew );
    if ( Vec_IntSize(vXorLits) == 0 )
    {
        Abc_Print( 1, "Speculatively reduced model has no primary outputs.\n" );
        Gia_ManAppendCo( pNew, 0 );
    }
    Gia_ManForEachRi( p, pObj, i )
        Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManHashStop( pNew );
    Vec_IntFree( vXorLits );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}